

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3a111::DryRunCommandRunner::StartCommand(DryRunCommandRunner *this,Edge *edge)

{
  Edge *local_18;
  Edge *edge_local;
  DryRunCommandRunner *this_local;
  
  local_18 = edge;
  edge_local = (Edge *)this;
  std::queue<Edge_*,_std::deque<Edge_*,_std::allocator<Edge_*>_>_>::push(&this->finished_,&local_18)
  ;
  return true;
}

Assistant:

bool DryRunCommandRunner::StartCommand(Edge* edge) {
  finished_.push(edge);
  return true;
}